

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.h
# Opt level: O3

tensor * __thiscall
dlib::sgd::operator()
          (sgd *this,float learning_rate,avg_pool_<2L,_2L,_2,_2,_0,_0> *l,tensor *params_grad)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  fatal_error *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined8 in_XMM1_Qa;
  undefined1 auVar8 [16];
  ostringstream dlib_o_out;
  string local_1b8;
  long local_198 [3];
  uint auStack_180 [88];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = learning_rate;
  if ((l->params).super_tensor.m_size != 0) {
    if ((this->v).super_tensor.m_size == 0) {
      resizable_tensor::copy_size(&this->v,params_grad);
      iVar3 = (*(this->v).super_tensor._vptr_tensor[4])(this);
      lVar2 = (this->v).super_tensor.m_size;
      if (lVar2 != 0) {
        memset((void *)CONCAT44(extraout_var,iVar3),0,lVar2 << 2);
      }
    }
    auVar8._0_8_ = (double)this->weight_decay;
    auVar8._8_8_ = in_XMM1_Qa;
    auVar5._12_4_ = 0x80000000;
    auVar5._0_12_ = ZEXT812(0x8000000000000000);
    auVar5 = vxorpd_avx512vl(auVar8,auVar5);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar7._0_16_,auVar6);
    tt::affine_transform
              ((tensor *)this,(tensor *)this,&(l->params).super_tensor,params_grad,this->momentum,
               (float)((double)learning_rate * auVar5._0_8_),auVar6._0_4_);
    return (tensor *)this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\nError detected at line ",0x19);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,0x2e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/solvers.h"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "const tensor &dlib::sgd::operator()(const float, const layer_type &, const tensor &) [layer_type = dlib::avg_pool_<2, 2, 2, 2>]"
             ,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"params.size() != 0",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

const tensor& operator() (
            const float learning_rate,
            const layer_type& l,
            const tensor& params_grad
        )
        {
            const tensor& params = l.get_layer_params();

            DLIB_CASSERT(params.size() != 0);
            if (v.size() == 0)
            {
                v.copy_size(params_grad);
                v = 0;
            }

            const double lr = learning_rate*get_learning_rate_multiplier(l);
            const double wd = weight_decay*get_weight_decay_multiplier(l);
            
            //perform: v = momentum*mat(v) - wd*lr*mat(params) - lr*mat(params_grad);
            tt::affine_transform(v, v, params, params_grad, momentum, -wd*lr, -lr);

            return v;
        }